

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

string * __thiscall
re2::DFA::DumpState_abi_cxx11_(string *__return_storage_ptr__,DFA *this,State *state)

{
  string local_a0;
  string local_80;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  char *local_38;
  char *sep;
  allocator<char> local_19;
  DFA *local_18;
  State *state_local;
  string *s;
  
  local_18 = this;
  state_local = (State *)__return_storage_ptr__;
  if (this == (DFA *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"_",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else if (this == (DFA *)0x1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"X",(allocator<char> *)((long)&sep + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 3));
  }
  else if (this == (DFA *)0x2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"*",(allocator<char> *)((long)&sep + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 2));
  }
  else {
    sep._1_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_38 = "";
    StringPrintf_abi_cxx11_((string *)local_58,"(%p)",local_18);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    for (local_5c = 0; local_5c < (int)local_18->kind_; local_5c = local_5c + 1) {
      if (local_18->prog_->inst_count_[(long)local_5c + -0xd] == -1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"|");
        local_38 = "";
      }
      else if (local_18->prog_->inst_count_[(long)local_5c + -0xd] == -2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"||");
        local_38 = "";
      }
      else {
        StringPrintf_abi_cxx11_
                  (&local_80,"%s%d",local_38,
                   (ulong)(uint)local_18->prog_->inst_count_[(long)local_5c + -0xd]);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        local_38 = ",";
      }
    }
    StringPrintf_abi_cxx11_(&local_a0," flag=%#x",(ulong)*(uint *)&local_18->init_failed_);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpState(State* state) {
  if (state == NULL)
    return "_";
  if (state == DeadState)
    return "X";
  if (state == FullMatchState)
    return "*";
  std::string s;
  const char* sep = "";
  s += StringPrintf("(%p)", state);
  for (int i = 0; i < state->ninst_; i++) {
    if (state->inst_[i] == Mark) {
      s += "|";
      sep = "";
    } else if (state->inst_[i] == MatchSep) {
      s += "||";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, state->inst_[i]);
      sep = ",";
    }
  }
  s += StringPrintf(" flag=%#x", state->flag_);
  return s;
}